

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderUintPrecisionCase::ShaderUintPrecisionCase
          (ShaderUintPrecisionCase *this,Context *context,char *name,char *desc,char *op,
          EvalFunc evalFunc,Precision precision,int bits,UVec2 *rangeA,UVec2 *rangeB,
          bool isVertexCase)

{
  deUint32 seed;
  long lVar1;
  allocator<char> local_29;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderUintPrecisionCase_00d21560;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_op,op,&local_29);
  this->m_evalFunc = evalFunc;
  this->m_precision = precision;
  this->m_bits = bits;
  lVar1 = 0;
  do {
    (this->m_rangeA).m_data[lVar1] = rangeA->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    (this->m_rangeB).m_data[lVar1] = rangeB->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  this->m_isVertexCase = isVertexCase;
  this->m_numTestsPerIter = 0x20;
  this->m_numIters = 4;
  seed = deStringHash(name);
  deRandom_init(&(this->m_rnd).m_rnd,seed);
  this->m_program = (ShaderProgram *)0x0;
  this->m_framebuffer = 0;
  this->m_renderbuffer = 0;
  this->m_iterNdx = 0;
  return;
}

Assistant:

ShaderUintPrecisionCase::ShaderUintPrecisionCase (Context& context, const char* name, const char* desc, const char* op, EvalFunc evalFunc, glu::Precision precision, int bits, const tcu::UVec2& rangeA, const tcu::UVec2& rangeB, bool isVertexCase)
	: TestCase			(context, name, desc)
	, m_op				(op)
	, m_evalFunc		(evalFunc)
	, m_precision		(precision)
	, m_bits			(bits)
	, m_rangeA			(rangeA)
	, m_rangeB			(rangeB)
	, m_isVertexCase	(isVertexCase)
	, m_numTestsPerIter	(32)
	, m_numIters		(4)
	, m_rnd				(deStringHash(name))
	, m_program			(DE_NULL)
	, m_framebuffer		(0)
	, m_renderbuffer	(0)
	, m_iterNdx			(0)
{
}